

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintUInt64
          (FastFieldValuePrinter *this,uint64 val,BaseTextGenerator *generator)

{
  AlphaNum *a;
  AlphaNum local_70;
  string local_40;
  
  strings::AlphaNum::AlphaNum(&local_70,val);
  StrCat_abi_cxx11_(&local_40,(protobuf *)&local_70,a);
  (*generator->_vptr_BaseTextGenerator[5])
            (generator,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintUInt64(
    uint64 val, BaseTextGenerator* generator) const {
  generator->PrintString(StrCat(val));
}